

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O1

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,SmallBuffer *sb)

{
  size_t sVar1;
  byte *pbVar2;
  
  if (this->locked == true) {
    if (this == sb) {
      return this;
    }
    sVar1 = sb->bufferSize;
    reserve(this,sVar1);
    this->bufferSize = sVar1;
    memcpy(this->heap,sb->heap,sb->bufferSize);
    return this;
  }
  if (this->usingAllocatedBuffer == true) {
    pbVar2 = this->heap;
    if (this->nonOwning == true) {
      if (sb->heap == pbVar2) {
        sVar1 = sb->bufferCapacity;
        this->bufferSize = sb->bufferSize;
        this->bufferCapacity = sVar1;
        return this;
      }
    }
    else {
      if (sb->heap == pbVar2) {
        this->bufferSize = sb->bufferSize;
        return this;
      }
      if (pbVar2 != (byte *)0x0) {
        operator_delete__(pbVar2);
      }
    }
  }
  if (sb->usingAllocatedBuffer == true) {
    this->heap = sb->heap;
    this->bufferCapacity = sb->bufferCapacity;
    this->usingAllocatedBuffer = true;
    this->nonOwning = sb->nonOwning;
  }
  else {
    memcpy(this,sb->heap,sb->bufferSize);
    this->usingAllocatedBuffer = false;
    this->nonOwning = false;
    this->heap = (byte *)this;
    this->bufferCapacity = 0x40;
  }
  this->locked = sb->locked;
  this->bufferSize = sb->bufferSize;
  sb->heap = (byte *)sb;
  sb->bufferCapacity = 0x40;
  sb->bufferSize = 0;
  sb->locked = false;
  sb->usingAllocatedBuffer = false;
  return this;
}

Assistant:

SmallBuffer& operator=(SmallBuffer&& sb) noexcept
    {
        if (locked) {
            // if locked then use the copy operation not move
            const SmallBuffer& buf = sb;
            try {
                return operator=(buf);
            }
            catch (std::bad_alloc&) {
                errorCondition = 2;
                return *this;
            }
        }
        if (usingAllocatedBuffer) {
            if (nonOwning) {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    bufferCapacity = sb.bufferCapacity;
                    return *this;
                }
            } else {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    return *this;
                }
                delete[] heap;
            }
        }

        if (sb.usingAllocatedBuffer) {
            heap = sb.heap;
            bufferCapacity = sb.bufferCapacity;
            usingAllocatedBuffer = true;
            nonOwning = sb.nonOwning;
        } else {
            std::memcpy(buffer.data(), sb.heap, sb.bufferSize);
            usingAllocatedBuffer = false;
            nonOwning = false;
            heap = buffer.data();
            bufferCapacity = 64;
        }
        locked = sb.locked;
        bufferSize = sb.bufferSize;
        sb.heap = sb.buffer.data();
        sb.bufferCapacity = 64;
        sb.bufferSize = 0;
        sb.usingAllocatedBuffer = false;
        sb.locked = false;

        return *this;
    }